

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::
Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
::walkFunctionInModule
          (Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           *this,Function *func,Module *module)

{
  Module *module_local;
  Function *func_local;
  Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
  *this_local;
  
  setModule(this,module);
  setFunction(this,func);
  SimplifyLocals<true,_false,_true>::doWalkFunction
            ((SimplifyLocals<true,_false,_true> *)&this[-1].stack.fixed._M_elems[9].currp,func);
  Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>::visitFunction
            ((Visitor<wasm::SimplifyLocals<true,_false,_true>,_void> *)this,func);
  setFunction(this,(Function *)0x0);
  setModule(this,(Module *)0x0);
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }